

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::EvaluateMeshGeometry(ON_Mesh *this,ON_Surface *srf)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  ON_SurfaceCurvature *kappa1;
  ON_SurfaceCurvature *pOVar6;
  ON_3fPoint *pOVar7;
  ON_3dPoint *pOVar8;
  ON_3fVector *pOVar9;
  int local_1d0;
  int local_1cc;
  ON_3fPoint local_1bc;
  ON_3fVector local_1b0;
  ON_3fPoint local_1a4;
  ON_3fVector local_198;
  ON_3fPoint local_18c;
  ON_Interval local_180;
  double local_170;
  double tmax;
  double local_158;
  double smax;
  double kmean;
  double kgauss;
  double t;
  double s;
  ON_2dPoint *srf_st;
  ON_3dVector K2;
  ON_3dVector K1;
  ON_3dVector Dtt;
  ON_3dVector Dst;
  ON_3dVector Dss;
  ON_3dVector Dt;
  ON_3dVector Ds;
  ON_3dVector normal;
  ON_3dPoint point;
  int hint [2];
  int side;
  int vi;
  bool bHasVertexNormals;
  bool bHasDoublePrecisionVertices;
  bool bHasSurfaceParameters;
  int vcount;
  bool rc;
  ON_Surface *srf_local;
  ON_Mesh *this_local;
  
  bHasSurfaceParameters = false;
  iVar4 = VertexCount(this);
  bVar1 = HasSurfaceParameters(this);
  if (bVar1) {
    bVar1 = HasDoublePrecisionVertices(this);
    if (!bVar1) {
      ON_SimpleArray<ON_3dPoint>::Destroy(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
    }
    bVar2 = HasVertexNormals(this);
    ON_SimpleArray<ON_3fVector>::SetCapacity
              (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,(long)iVar4);
    point.z._4_4_ = 0;
    (*(srf->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(srf,0);
    pdVar5 = ON_Interval::operator[]((ON_Interval *)&tmax,1);
    local_158 = *pdVar5;
    (*(srf->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(srf,1);
    pdVar5 = ON_Interval::operator[](&local_180,1);
    local_170 = *pdVar5;
    bVar3 = HasPrincipalCurvatures(this);
    if (bVar3) {
      for (hint[1] = 0; hint[1] < iVar4; hint[1] = hint[1] + 1) {
        s = (double)ON_SimpleArray<ON_2dPoint>::operator[]
                              (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,hint[1]);
        t = ((ON_2dPoint *)s)->x;
        kgauss = ((ON_2dPoint *)s)->y;
        if ((local_158 != t) || (NAN(local_158) || NAN(t))) {
          local_1cc = 1;
          if (local_170 == kgauss) {
            local_1cc = 4;
          }
        }
        else {
          local_1cc = 2;
          if (local_170 == kgauss) {
            local_1cc = 3;
          }
        }
        ON_Surface::Ev2Der(srf,t,kgauss,(ON_3dPoint *)&normal.z,(ON_3dVector *)&Dt.z,
                           (ON_3dVector *)&Dss.z,(ON_3dVector *)&Dst.z,(ON_3dVector *)&Dtt.z,
                           (ON_3dVector *)&K1.z,local_1cc,(int *)((long)&point.z + 4));
        ON_EvNormal(local_1cc,(ON_3dVector *)&Dt.z,(ON_3dVector *)&Dss.z,(ON_3dVector *)&Dst.z,
                    (ON_3dVector *)&Dtt.z,(ON_3dVector *)&K1.z,(ON_3dVector *)&Ds.z);
        kappa1 = ON_SimpleArray<ON_SurfaceCurvature>::operator[](&this->m_K,hint[1]);
        pOVar6 = ON_SimpleArray<ON_SurfaceCurvature>::operator[](&this->m_K,hint[1]);
        ON_EvPrincipalCurvatures
                  ((ON_3dVector *)&Dt.z,(ON_3dVector *)&Dss.z,(ON_3dVector *)&Dst.z,
                   (ON_3dVector *)&Dtt.z,(ON_3dVector *)&K1.z,(ON_3dVector *)&Ds.z,&kmean,&smax,
                   &kappa1->k1,&pOVar6->k2,(ON_3dVector *)&K2.z,(ON_3dVector *)&srf_st);
        ON_3fPoint::ON_3fPoint(&local_18c,&normal.z);
        pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[]
                           (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,hint[1]);
        pOVar7->x = local_18c.x;
        pOVar7->y = local_18c.y;
        pOVar7->z = local_18c.z;
        if (bVar1) {
          pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                             (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,hint[1]);
          pOVar8->x = normal.z;
          pOVar8->y = point.x;
          pOVar8->z = point.y;
        }
        if (bVar2) {
          ON_3fVector::ON_3fVector(&local_198,&Ds.z);
          pOVar9 = ON_SimpleArray<ON_3fVector>::operator[]
                             (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,hint[1]);
          pOVar9->x = local_198.x;
          pOVar9->y = local_198.y;
          pOVar9->z = local_198.z;
        }
      }
      InvalidateCurvatureStats(this);
    }
    else if (bVar2) {
      for (hint[1] = 0; hint[1] < iVar4; hint[1] = hint[1] + 1) {
        s = (double)ON_SimpleArray<ON_2dPoint>::operator[]
                              (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,hint[1]);
        t = ((ON_2dPoint *)s)->x;
        kgauss = ((ON_2dPoint *)s)->y;
        if ((local_158 != t) || (NAN(local_158) || NAN(t))) {
          local_1d0 = 1;
          if (local_170 == kgauss) {
            local_1d0 = 4;
          }
        }
        else {
          local_1d0 = 2;
          if (local_170 == kgauss) {
            local_1d0 = 3;
          }
        }
        ON_Surface::EvNormal
                  (srf,t,kgauss,(ON_3dPoint *)&normal.z,(ON_3dVector *)&Ds.z,local_1d0,
                   (int *)((long)&point.z + 4));
        ON_3fPoint::ON_3fPoint(&local_1a4,&normal.z);
        pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[]
                           (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,hint[1]);
        pOVar7->x = local_1a4.x;
        pOVar7->y = local_1a4.y;
        pOVar7->z = local_1a4.z;
        if (bVar1) {
          pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                             (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,hint[1]);
          pOVar8->x = normal.z;
          pOVar8->y = point.x;
          pOVar8->z = point.y;
        }
        ON_3fVector::ON_3fVector(&local_1b0,&Ds.z);
        pOVar9 = ON_SimpleArray<ON_3fVector>::operator[]
                           (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,hint[1]);
        pOVar9->x = local_1b0.x;
        pOVar9->y = local_1b0.y;
        pOVar9->z = local_1b0.z;
      }
    }
    else {
      for (hint[1] = 0; hint[1] < iVar4; hint[1] = hint[1] + 1) {
        s = (double)ON_SimpleArray<ON_2dPoint>::operator[]
                              (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,hint[1]);
        t = ((ON_2dPoint *)s)->x;
        kgauss = ((ON_2dPoint *)s)->y;
        ON_Surface::EvPoint(srf,t,kgauss,(ON_3dPoint *)&normal.z,0,(int *)((long)&point.z + 4));
        ON_3fPoint::ON_3fPoint(&local_1bc,&normal.z);
        pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[]
                           (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,hint[1]);
        pOVar7->x = local_1bc.x;
        pOVar7->y = local_1bc.y;
        pOVar7->z = local_1bc.z;
        if (bVar1) {
          pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                             (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,hint[1]);
          pOVar8->x = normal.z;
          pOVar8->y = point.x;
          pOVar8->z = point.y;
        }
      }
    }
    bVar1 = HasFaceNormals(this);
    if (bVar1) {
      ComputeFaceNormals(this);
    }
    bHasSurfaceParameters = true;
    ON_MappingTag::Default(&this->m_Ctag);
    InvalidateVertexBoundingBox(this);
    InvalidateVertexNormalBoundingBox(this);
    DeleteMeshParameters(this);
    DestroyTree(this,true);
  }
  return bHasSurfaceParameters;
}

Assistant:

bool ON_Mesh::EvaluateMeshGeometry( const ON_Surface& srf )
{
  bool rc = false;
  const int vcount = VertexCount();
  const bool bHasSurfaceParameters = HasSurfaceParameters();
  if ( bHasSurfaceParameters )
  {
    const bool bHasDoublePrecisionVertices = this->HasDoublePrecisionVertices();
    if (false == bHasDoublePrecisionVertices)
      this->m_dV.Destroy();
    const bool bHasVertexNormals = HasVertexNormals();
    m_N.SetCapacity(vcount);
    int vi, side, hint[2];
    ON_3dPoint point;
    ON_3dVector normal, Ds, Dt, Dss, Dst, Dtt, K1, K2;
    const ON_2dPoint* srf_st;
    double s, t, kgauss, kmean;
    side = 0;
    hint[0] = 0;
    hint[1] = 0;
    const double smax = srf.Domain(0)[1];
    const double tmax = srf.Domain(1)[1];
    if ( HasPrincipalCurvatures() ) 
    {
      for ( vi = 0; vi < vcount; vi++ ) 
      {
        //ON_2fPoint& tex = m_T[vi];
        // convert texture coordinates to normalizied texture coordinates
        srf_st = &m_S[vi];
        s = srf_st->x;
        t = srf_st->y;
        // 19 April 2006 Dale Lear - added side setter so singular normals
        //                           are correctly evaluated RR 12482
        side = ( smax == s ) ? ((tmax == t) ? 3 : 2) : ((tmax == t) ? 4 : 1);
        srf.Ev2Der( s, t, point, Ds, Dt, Dss, Dst, Dtt, side, hint );
        ON_EvNormal( side, Ds, Dt, Dss, Dst, Dtt, normal );
        ON_EvPrincipalCurvatures( Ds, Dt, Dss, Dst, Dtt, normal,
                                  &kgauss, &kmean, 
                                  &m_K[vi].k1, &m_K[vi].k2, 
                                  K1, K2 ); //m_K[vi].e1, m_K[vi].e2 );
        m_V[vi] = ON_3fPoint(&point.x); // use ON_3fPoint double* conversion (quiets gcc)
        if (bHasDoublePrecisionVertices)
          m_dV[vi] = point;
        if ( bHasVertexNormals )
          m_N[vi] = ON_3fVector(&normal.x); // use ON_3fVector double* conversion (quiets gcc)
      }
      InvalidateCurvatureStats();
    }
    else if ( bHasVertexNormals ) 
    {
      for ( vi = 0; vi < vcount; vi++ ) 
      {
        //ON_2fPoint& tex = m_T[vi];
        srf_st = &m_S[vi];
        s = srf_st->x;
        t = srf_st->y;
        // 19 April 2006 Dale Lear - added side setter so singular normals
        //                           are correctly evaluated RR 12482
        side = ( smax == s ) ? ((tmax == t) ? 3 : 2) : ((tmax == t) ? 4 : 1);
        srf.EvNormal( s, t, point, normal, side, hint );
        m_V[vi] = ON_3fPoint(&point.x); // use ON_3fPoint double* conversion (quiets gcc)
        if (bHasDoublePrecisionVertices)
          m_dV[vi] = point;
        m_N[vi] = ON_3fVector(&normal.x); // use ON_3fVector double* conversion (quiets gcc)
      }
    }
    else 
    {
      for ( vi = 0; vi < vcount; vi++ ) 
      {
        //ON_2fPoint& tex = m_T[vi];
        srf_st = &m_S[vi];
        s = srf_st->x;
        t = srf_st->y;
        srf.EvPoint( s, t, point, side, hint );
        m_V[vi] = ON_3fPoint(&point.x);
        if (bHasDoublePrecisionVertices)
          m_dV[vi] = point;
      }
    }
    if ( HasFaceNormals() )
    {
      ComputeFaceNormals();
    }
    rc = true;

    m_Ctag.Default();
    InvalidateVertexBoundingBox();
    InvalidateVertexNormalBoundingBox();
    DeleteMeshParameters();
    DestroyTree();
  }
  return rc;
}